

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.h
# Opt level: O1

void nowtech::log::
     Log<nowtech::log::QueueStdBoost<nowtech::log::MessageCompact<8UL,_true>,_nowtech::log::AppInterfaceStd<(unsigned_char)'\x02',_false,_100UL>,_444UL>,_nowtech::log::SenderStdOstream<nowtech::log::AppInterfaceStd<(unsigned_char)'\x02',_false,_100UL>,_nowtech::log::ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>,_123UL,_123U>,_(signed_char)'\x02',_(nowtech::log::TaskRepresentation)2,_0UL,_444U>
     ::transmit(MessageQueue *aList)

{
  _List_node_header *p_Var1;
  _List_node_base *p_Var2;
  PoolAllocatorBase<nowtech::log::AppInterfaceStd<(unsigned_char)__x02_,_false,_100UL>::Occupier>
  *pPVar3;
  Iterator pcVar4;
  _Node *__tmp;
  _List_node_base *in_RCX;
  PoolAllocatorBase<nowtech::log::AppInterfaceStd<(unsigned_char)__x02_,_false,_100UL>::Occupier>
  *in_RDX;
  PoolAllocatorBase<nowtech::log::AppInterfaceStd<(unsigned_char)__x02_,_false,_100UL>::Occupier>
  *extraout_RDX;
  MessageQueue *__range3;
  tConverter converter;
  ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)_d_,_true,_false>
  local_38;
  
  pcVar4 = SenderStdOstream<nowtech::log::AppInterfaceStd<(unsigned_char)'\x02',_false,_100UL>,_nowtech::log::ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>,_123UL,_123U>
           ::sBegin;
  p_Var1 = &(aList->
            super__List_base<nowtech::log::MessageCompact<8UL,_true>,_nowtech::memory::PoolAllocator<nowtech::log::MessageCompact<8UL,_true>,_nowtech::log::AppInterfaceStd<(unsigned_char)__x02_,_false,_100UL>::Occupier>_>
            )._M_impl._M_node;
  local_38.mBegin =
       SenderStdOstream<nowtech::log::AppInterfaceStd<(unsigned_char)'\x02',_false,_100UL>,_nowtech::log::ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>,_123UL,_123U>
       ::sBegin;
  local_38.mEnd =
       SenderStdOstream<nowtech::log::AppInterfaceStd<(unsigned_char)'\x02',_false,_100UL>,_nowtech::log::ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>,_123UL,_123U>
       ::sEnd;
  for (p_Var2 = (aList->
                super__List_base<nowtech::log::MessageCompact<8UL,_true>,_nowtech::memory::PoolAllocator<nowtech::log::MessageCompact<8UL,_true>,_nowtech::log::AppInterfaceStd<(unsigned_char)__x02_,_false,_100UL>::Occupier>_>
                )._M_impl._M_node.super__List_node_base._M_next;
      (_List_node_header *)p_Var2 != p_Var1; p_Var2 = p_Var2->_M_next) {
    MessageCompact<8ul,true>::
    output<nowtech::log::ConverterCustomText<nowtech::log::MessageCompact<8ul,true>,true,(unsigned_char)100,true,false>>
              ((MessageCompact<8ul,true> *)(p_Var2 + 1),&local_38);
    in_RDX = extraout_RDX;
  }
  p_Var2 = (p_Var1->super__List_node_base)._M_next;
  while ((_List_node_header *)p_Var2 != p_Var1) {
    in_RCX = p_Var2->_M_next;
    pPVar3 = (aList->
             super__List_base<nowtech::log::MessageCompact<8UL,_true>,_nowtech::memory::PoolAllocator<nowtech::log::MessageCompact<8UL,_true>,_nowtech::log::AppInterfaceStd<(unsigned_char)__x02_,_false,_100UL>::Occupier>_>
             )._M_impl.super__Node_alloc_type.
             super_PoolAllocatorBase<nowtech::log::AppInterfaceStd<(unsigned_char)__x02_,_false,_100UL>::Occupier>
             .mOriginal;
    p_Var2->_M_next = (_List_node_base *)pPVar3->mOriginal->mFirst;
    in_RDX = pPVar3->mOriginal;
    in_RDX->mFirst = &p_Var2->_M_next;
    p_Var2 = in_RCX;
  }
  (aList->
  super__List_base<nowtech::log::MessageCompact<8UL,_true>,_nowtech::memory::PoolAllocator<nowtech::log::MessageCompact<8UL,_true>,_nowtech::log::AppInterfaceStd<(unsigned_char)__x02_,_false,_100UL>::Occupier>_>
  )._M_impl._M_node.super__List_node_base._M_prev = &p_Var1->super__List_node_base;
  (aList->
  super__List_base<nowtech::log::MessageCompact<8UL,_true>,_nowtech::memory::PoolAllocator<nowtech::log::MessageCompact<8UL,_true>,_nowtech::log::AppInterfaceStd<(unsigned_char)__x02_,_false,_100UL>::Occupier>_>
  )._M_impl._M_node.super__List_node_base._M_next = &p_Var1->super__List_node_base;
  (aList->
  super__List_base<nowtech::log::MessageCompact<8UL,_true>,_nowtech::memory::PoolAllocator<nowtech::log::MessageCompact<8UL,_true>,_nowtech::log::AppInterfaceStd<(unsigned_char)__x02_,_false,_100UL>::Occupier>_>
  )._M_impl._M_node._M_size = 0;
  if (local_38.mBegin < local_38.mEnd) {
    *local_38.mBegin = '\n';
    local_38.mBegin = local_38.mBegin + 1;
  }
  SenderStdOstream<nowtech::log::AppInterfaceStd<(unsigned_char)'\x02',_false,_100UL>,_nowtech::log::ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>,_123UL,_123U>
  ::send((int)pcVar4,local_38.mBegin,(size_t)in_RDX,(int)in_RCX);
  return;
}

Assistant:

static void transmit(MessageQueue &aList) noexcept {
    auto [begin, end] = tSender::getBuffer();
    tConverter converter(begin, end);
    for(auto &message : aList) {
      message.template output<tConverter>(converter);
    }
    aList.clear();
    converter.terminateSequence();
    tSender::send(begin, converter.end());
  }